

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_capacity_suite.cpp
# Opt level: O0

void max_size_suite::test_null(void)

{
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_48[0] = trial::dynamic::basic_variable<std::allocator<char>_>::max_size
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.max_size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x16f,"void max_size_suite::test_null()",local_48,&local_4c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_null()
{
    variable data;
    TRIAL_PROTOCOL_TEST_EQUAL(data.max_size(), 0);
}